

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::MemoryMapping::randomWrite(MemoryMapping *this,Random *rng)

{
  void *__n;
  byte bVar1;
  int iVar2;
  deUint64 dVar3;
  ulong uVar4;
  deUint8 val;
  size_t pos;
  size_t ndx;
  size_t count;
  Random *rng_local;
  MemoryMapping *this_local;
  
  iVar2 = de::Random::getInt(rng,0,100);
  for (pos = 0; pos < (ulong)(long)iVar2; pos = pos + 1) {
    dVar3 = de::Random::getUint64(rng);
    uVar4 = dVar3 % (this->m_range).size;
    bVar1 = de::Random::getUint8(rng);
    __n = this->m_ptr;
    *(byte *)((long)__n + uVar4) = bVar1;
    ReferenceMemory::write
              (this->m_reference,(int)(this->m_range).offset + (int)uVar4,(void *)(ulong)bVar1,
               (size_t)__n);
  }
  return;
}

Assistant:

void MemoryMapping::randomWrite (de::Random& rng)
{
	const size_t count = (size_t)rng.getInt(0, 100);

	for (size_t ndx = 0; ndx < count; ndx++)
	{
		const size_t	pos	= (size_t)(rng.getUint64() % (deUint64)m_range.size);
		const deUint8	val	= rng.getUint8();

		((deUint8*)m_ptr)[pos]	= val;
		m_reference.write((size_t)(m_range.offset + pos), val);
	}
}